

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLexer.cpp
# Opt level: O0

JsonLexer * __thiscall json::JsonLexer::readDigits_abi_cxx11_(JsonLexer *this,istream *input)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  char local_1a;
  char c;
  istream *input_local;
  string *digits;
  
  std::__cxx11::string::string((string *)this);
  while( true ) {
    plVar3 = (long *)std::istream::get((char *)input);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
    if (!bVar1) {
      return this;
    }
    iVar2 = isdigit((int)local_1a);
    if (iVar2 == 0) break;
    std::__cxx11::string::operator+=((string *)this,local_1a);
  }
  std::istream::putback((char)input);
  return this;
}

Assistant:

std::string JsonLexer::readDigits(std::istream &input)
    {
        std::string digits;
        char c;
        while (input.get(c))
        {
            if (isdigit(c))
            {
                digits += c;
            }
            else
            {
                // If we get something that's not a digit put it back into the stream and break the loop.
                input.putback(c);
                break;
            }
        }
        return digits;
    }